

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_color.cxx
# Opt level: O3

void figure_out_visual(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  beenhere = 1;
  uVar1 = fl_visual->red_mask;
  if (((uVar1 == 0) || (uVar2 = fl_visual->green_mask, uVar2 == 0)) ||
     (uVar3 = fl_visual->blue_mask, uVar3 == 0)) {
    fl_redmask = '\0';
    return;
  }
  iVar4 = 0;
  iVar6 = 1;
  do {
    iVar5 = iVar4;
    if ((uVar1 & (long)iVar6) != 0) goto joined_r0x001e805d;
    iVar4 = iVar4 + 1;
    iVar6 = iVar6 * 2;
  } while (iVar4 != 0x20);
  iVar4 = 0x20;
  iVar5 = iVar4;
joined_r0x001e805d:
  for (; (iVar6 != 0 && ((uVar1 & (long)iVar6) != 0)); iVar6 = iVar6 * 2) {
    iVar4 = iVar4 + 1;
  }
  fl_redshift = iVar4 + -8;
  fl_redmask = ~(byte)(0xff >> ((byte)(iVar4 - iVar5) & 0x1f));
  if (7 < iVar4 - iVar5) {
    fl_redmask = 0xff;
  }
  iVar4 = 0;
  iVar6 = 1;
  do {
    iVar5 = iVar4;
    if ((uVar2 & (long)iVar6) != 0) goto joined_r0x001e80c0;
    iVar4 = iVar4 + 1;
    iVar6 = iVar6 * 2;
  } while (iVar4 != 0x20);
  iVar4 = 0x20;
  iVar5 = iVar4;
joined_r0x001e80c0:
  for (; (iVar6 != 0 && ((uVar2 & (long)iVar6) != 0)); iVar6 = iVar6 * 2) {
    iVar4 = iVar4 + 1;
  }
  fl_greenshift = iVar4 + -8;
  fl_greenmask = ~(byte)(0xff >> ((byte)(iVar4 - iVar5) & 0x1f));
  if (7 < iVar4 - iVar5) {
    fl_greenmask = 0xff;
  }
  iVar4 = 0;
  iVar6 = 1;
  do {
    iVar5 = iVar4;
    if ((uVar3 & (long)iVar6) != 0) goto joined_r0x001e8123;
    iVar4 = iVar4 + 1;
    iVar6 = iVar6 * 2;
  } while (iVar4 != 0x20);
  iVar4 = 0x20;
  iVar5 = iVar4;
joined_r0x001e8123:
  for (; (iVar6 != 0 && ((uVar3 & (long)iVar6) != 0)); iVar6 = iVar6 * 2) {
    iVar4 = iVar4 + 1;
  }
  fl_blueshift = iVar4 + -8;
  fl_bluemask = ~(byte)(0xff >> ((byte)(iVar4 - iVar5) & 0x1f));
  if (7 < iVar4 - iVar5) {
    fl_bluemask = 0xff;
  }
  iVar6 = fl_redshift;
  if (fl_greenshift < fl_redshift) {
    iVar6 = fl_greenshift;
  }
  if (fl_blueshift < iVar6) {
    iVar6 = fl_blueshift;
  }
  if (iVar6 < 0) {
    fl_extrashift = -iVar6;
    fl_redshift = fl_redshift - iVar6;
    fl_greenshift = fl_greenshift - iVar6;
    fl_blueshift = fl_blueshift - iVar6;
    return;
  }
  fl_extrashift = 0;
  return;
}

Assistant:

static void figure_out_visual() {
  beenhere = 1;
  if (!fl_visual->red_mask || !fl_visual->green_mask || !fl_visual->blue_mask){
#  if USE_COLORMAP
    fl_redmask = 0;
    return;
#  else
    Fl::fatal("Requires true color visual");
#  endif
  }

  // get the bit masks into a more useful form:
  int i,j,m;

  for (i = 0, m = 1; m; i++, m<<=1) if (fl_visual->red_mask & m) break;
  for (j = i; m; j++, m<<=1) if (!(fl_visual->red_mask & m)) break;
  fl_redshift = j-8;
  fl_redmask = (j-i >= 8) ? 0xFF : 0xFF-(255>>(j-i));

  for (i = 0, m = 1; m; i++, m<<=1) if (fl_visual->green_mask & m) break;
  for (j = i; m; j++, m<<=1) if (!(fl_visual->green_mask & m)) break;
  fl_greenshift = j-8;
  fl_greenmask = (j-i >= 8) ? 0xFF : 0xFF-(255>>(j-i));

  for (i = 0, m = 1; m; i++, m<<=1) if (fl_visual->blue_mask & m) break;
  for (j = i; m; j++, m<<=1) if (!(fl_visual->blue_mask & m)) break;
  fl_blueshift = j-8;
  fl_bluemask = (j-i >= 8) ? 0xFF : 0xFF-(255>>(j-i));

  i = fl_redshift;
  if (fl_greenshift < i) i = fl_greenshift;
  if (fl_blueshift < i) i = fl_blueshift;
  if (i < 0) {
    fl_extrashift = -i;
    fl_redshift -= i; fl_greenshift -= i; fl_blueshift -= i;
  } else
    fl_extrashift = 0;

}